

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_pubnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_pubnonce *nonce)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  int i;
  secp256k1_ge *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = secp256k1_memcmp_var(in_RDX,secp256k1_musig_pubnonce_magic,4);
  if (iVar1 == 0) {
    for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
      secp256k1_ge_from_bytes(in_stack_00000020,(uchar *)ctx);
    }
    local_4 = 1;
  }
  else {
    secp256k1_callback_call
              (in_RDX,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_musig_pubnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_pubnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_pubnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes(&ges[i], nonce->data + 4 + 64*i);
    }
    return 1;
}